

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O3

vector<long,_std::allocator<long>_> * __thiscall
anurbs::RTree<2l>::search<anurbs::RTree<2l>::PickByRay>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,void *this,PickByRay *check,
          Callback *callback)

{
  double *pdVar1;
  iterator __position;
  bool bVar2;
  runtime_error *this_00;
  long lVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  Index index;
  Vector node_max;
  long local_a0;
  vector<long,_std::allocator<long>_> local_98;
  vector<long,std::allocator<long>> *local_80;
  long local_78;
  _Any_data *local_70;
  Vector local_68;
  Vector local_58;
  double local_48;
  double dStack_40;
  
  lVar3 = *(long *)((long)this + 0x50);
  local_70 = (_Any_data *)callback;
  if (lVar3 != *(long *)((long)this + 0x60) - *(long *)((long)this + 0x58) >> 3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Data not yet indexed - call RTree::finish().");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar7 = *(long *)((long)this + 0x10);
  lVar4 = *(long *)((long)this + 0x18);
  local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (long *)0x0;
  local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (long *)0x0;
  local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (long *)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80 = (vector<long,std::allocator<long>> *)__return_storage_ptr__;
  if (0 < lVar3) {
    lVar3 = lVar3 + -1;
    lVar7 = (lVar4 - lVar7 >> 3) + -1;
    plVar5 = (long *)0x0;
    do {
      lVar6 = *(long *)((long)this + 8) + lVar3;
      lVar4 = *(long *)(*(long *)((long)this + 0x10) + lVar7 * 8);
      if (lVar4 < lVar6) {
        lVar6 = lVar4;
      }
      if (lVar3 < lVar6) {
        lVar7 = lVar7 + -1;
        lVar4 = lVar3 * 8;
        do {
          local_a0 = *(long *)(*(long *)((long)this + 0x58) + lVar4);
          pdVar1 = (double *)(*(long *)((long)this + 0x88) + lVar4 * 2);
          local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
          array[0] = *pdVar1;
          local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
          array[1] = pdVar1[1];
          pdVar1 = (double *)(*(long *)((long)this + 0x70) + lVar4 * 2);
          local_58.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
          array[0] = *pdVar1;
          local_58.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
          array[1] = pdVar1[1];
          local_48 = local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage
                     .m_data.array[0];
          dStack_40 = local_68.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                      m_storage.m_data.array[1];
          bVar2 = RTree<2L>::PickByRay::operator()(check,&local_58,&local_68);
          if (bVar2) {
            if (lVar3 < *this) {
              if (*(long *)(local_70 + 1) != 0) {
                local_78 = local_a0;
                bVar2 = (**(code **)(local_70->_M_pod_data + 0x18))(local_70,&local_78);
                if (!bVar2) goto LAB_001c7213;
              }
              __position._M_current = *(long **)(local_80 + 8);
              if (__position._M_current == *(long **)(local_80 + 0x10)) {
                std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                          (local_80,__position,&local_a0);
              }
              else {
                *__position._M_current = local_a0;
                *(long **)(local_80 + 8) = __position._M_current + 1;
              }
            }
            else {
              if (local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                          ((vector<long,std::allocator<long>> *)&local_98,
                           (iterator)
                           local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_a0);
              }
              else {
                *local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_a0;
                local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_78 = lVar7;
              if (local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                          (&local_98,
                           (iterator)
                           local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_finish,&local_78);
              }
              else {
                *local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish = lVar7;
                local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
          }
LAB_001c7213:
          lVar6 = lVar6 + -1;
          lVar4 = lVar4 + 8;
          plVar5 = local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (lVar3 != lVar6);
      }
      if (plVar5 == local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish) break;
      lVar3 = local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish[-2];
      lVar7 = local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish + -2;
    } while (-1 < lVar3);
    if (plVar5 != (long *)0x0) {
      operator_delete(plVar5,(long)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)plVar5);
    }
  }
  return (vector<long,_std::allocator<long>_> *)local_80;
}

Assistant:

std::vector<Index> search(const TCheck& check, Callback callback)
    {
        if (m_position != length(m_indices)) {
            throw std::runtime_error("Data not yet indexed - call RTree::finish().");
        }

        Index node_index = length(m_indices) - 1;
        Index level = length(m_level_bounds) - 1;
        std::vector<Index> queue;
        std::vector<Index> results;

        while (node_index > -1) {
            const Index end = std::min<Index>(node_index + m_node_size, m_level_bounds[level]);

            for (Index pos = node_index; pos < end; pos++) {
                const Index index = m_indices[pos];

                const Vector node_min = m_boxes_min[pos];
                const Vector node_max = m_boxes_max[pos];

                if (!check(node_min, node_max)) {
                    continue;
                }

                if (node_index < m_nb_items) {
                    if (callback == nullptr || callback(index)) {
                        results.push_back(index);
                    }
                } else {
                    queue.push_back(index);
                    queue.push_back(level - 1);
                }
            }

            if (queue.empty()) {
                node_index = -1;
                level = -1;
            } else {
                level = queue.back();
                queue.pop_back();
                node_index = queue.back();
                queue.pop_back();
            }
        }

        return results;
    }